

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_hmi_midiout.cpp
# Opt level: O0

void __thiscall NoteOffQueue::AddNoteOff(NoteOffQueue *this,DWORD delay,BYTE channel,BYTE key)

{
  bool bVar1;
  uint uVar2;
  AutoNoteOff *pAVar3;
  AutoNoteOff *pAVar4;
  uint local_1c;
  uint i;
  BYTE key_local;
  BYTE channel_local;
  DWORD delay_local;
  NoteOffQueue *this_local;
  
  local_1c = TArray<AutoNoteOff,_AutoNoteOff>::Reserve
                       (&this->super_TArray<AutoNoteOff,_AutoNoteOff>,1);
  while( true ) {
    bVar1 = false;
    if (local_1c != 0) {
      uVar2 = Parent(this,local_1c);
      pAVar3 = TArray<AutoNoteOff,_AutoNoteOff>::operator[]
                         (&this->super_TArray<AutoNoteOff,_AutoNoteOff>,(ulong)uVar2);
      bVar1 = delay < pAVar3->Delay;
    }
    if (!bVar1) break;
    uVar2 = Parent(this,local_1c);
    pAVar3 = TArray<AutoNoteOff,_AutoNoteOff>::operator[]
                       (&this->super_TArray<AutoNoteOff,_AutoNoteOff>,(ulong)uVar2);
    pAVar4 = TArray<AutoNoteOff,_AutoNoteOff>::operator[]
                       (&this->super_TArray<AutoNoteOff,_AutoNoteOff>,(ulong)local_1c);
    *pAVar4 = *pAVar3;
    local_1c = Parent(this,local_1c);
  }
  pAVar3 = TArray<AutoNoteOff,_AutoNoteOff>::operator[]
                     (&this->super_TArray<AutoNoteOff,_AutoNoteOff>,(ulong)local_1c);
  pAVar3->Delay = delay;
  pAVar3 = TArray<AutoNoteOff,_AutoNoteOff>::operator[]
                     (&this->super_TArray<AutoNoteOff,_AutoNoteOff>,(ulong)local_1c);
  pAVar3->Channel = channel;
  pAVar3 = TArray<AutoNoteOff,_AutoNoteOff>::operator[]
                     (&this->super_TArray<AutoNoteOff,_AutoNoteOff>,(ulong)local_1c);
  pAVar3->Key = key;
  return;
}

Assistant:

void NoteOffQueue::AddNoteOff(DWORD delay, BYTE channel, BYTE key)
{
	unsigned int i = Reserve(1);
	while (i > 0 && (*this)[Parent(i)].Delay > delay)
	{
		(*this)[i] = (*this)[Parent(i)];
		i = Parent(i);
	}
	(*this)[i].Delay = delay;
	(*this)[i].Channel = channel;
	(*this)[i].Key = key;
}